

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall YAML::detail::node::mark_defined(node *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<YAML::detail::node_*> *in_RDI;
  node *dependency;
  iterator __end2;
  iterator __begin2;
  nodes *__range2;
  set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18;
  node *this_00;
  
  bVar1 = is_defined((node *)0x9dea88);
  if (!bVar1) {
    std::__shared_ptr_access<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x9dea9d);
    node_ref::mark_defined((node_ref *)0x9deaa5);
    this_00 = (node *)(in_RDI + 2);
    local_18._M_node =
         (_Base_ptr)
         std::
         set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>
         ::begin(in_stack_ffffffffffffffc8);
    local_20._M_node =
         (_Base_ptr)
         std::
         set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>
         ::end(in_stack_ffffffffffffffc8);
    while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
      std::_Rb_tree_const_iterator<YAML::detail::node_*>::operator*(in_RDI);
      mark_defined(this_00);
      std::_Rb_tree_const_iterator<YAML::detail::node_*>::operator++(in_RDI);
    }
    std::set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>
    ::clear((set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>
             *)0x9deb1c);
  }
  return;
}

Assistant:

void mark_defined() {
    if (is_defined())
      return;

    m_pRef->mark_defined();
    for (node* dependency : m_dependencies)
      dependency->mark_defined();
    m_dependencies.clear();
  }